

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ALSADriver.cpp
# Opt level: O3

bool __thiscall
ALSAMidiDriver::processSeqEvent
          (ALSAMidiDriver *this,snd_seq_event_t *seq_event,MidiSession *midiSession)

{
  ulong uVar1;
  snd_seq_event_type_t sVar2;
  uchar uVar3;
  uchar *abuf;
  MidiSession *midiSession_00;
  Bit8u *sysexData;
  int *piVar4;
  long lVar5;
  QDebug QVar6;
  SynthRoute *this_00;
  MasterClockNanos MVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  Bit32u msg;
  ulong uVar11;
  qsizetype qVar12;
  uint msg_00;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  anon_class_8_1_54a39814_for__M_pred cmp;
  QDebug local_78;
  uint local_70;
  undefined4 uStack_6c;
  QVarLengthArray<unsigned_char,_1000LL> *local_58;
  anon_class_8_1_54a39814_for__M_pred local_50;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined4 local_3c;
  char *local_38;
  
  this_00 = MidiSession::getSynthRoute(midiSession);
  sVar2 = seq_event->type;
  qVar12 = 0;
  switch(sVar2) {
  case '\x06':
    msg = *(uint3 *)&seq_event->data | 0x90;
    break;
  case '\a':
    msg = *(uint3 *)&seq_event->data | 0x80;
    break;
  case '\b':
  case '\t':
  case '\f':
  case '\x0f':
    goto switchD_00172cc6_caseD_8;
  case '\n':
    uVar10 = (seq_event->data).raw32.d[2] << 0x10 |
             (seq_event->data).note.duration << 8 | (uint)(seq_event->data).note.channel;
    goto LAB_00172e62;
  case '\v':
    msg = (seq_event->data).raw32.d[2] << 8 | (uint)(seq_event->data).note.channel | 0xc0;
    break;
  case '\r':
    uVar10 = (seq_event->data).raw32.d[2];
    msg = ((uVar10 & 0x3f80) << 9 | (uVar10 & 0x7f) << 8 | (uint)(seq_event->data).note.channel |
          0xe0) ^ 0x400000;
    break;
  case '\x0e':
    uVar10 = (seq_event->data).note.duration;
    if ((uVar10 & 0xe0) == 0x20) goto LAB_001730de;
    uVar10 = ((seq_event->data).raw32.d[2] & 0xffffff80) << 9 |
             uVar10 << 8 | (uint)(seq_event->data).note.channel;
LAB_00172e62:
    msg = uVar10 | 0xb0;
    break;
  case '\x10':
    if ((seq_event->data).note.duration != 0) goto LAB_001730de;
    uVar10 = (uint)(seq_event->data).note.channel;
    msg_00 = uVar10 | 0x64b0;
    MVar7 = MasterClock::getClockNanos();
    SynthRoute::pushMIDIShortMessage(this_00,midiSession,msg_00,MVar7);
    MVar7 = MasterClock::getClockNanos();
    SynthRoute::pushMIDIShortMessage(this_00,midiSession,uVar10 | 0x65b0,MVar7);
    msg = ((seq_event->data).raw32.d[2] << 9 | msg_00) & 0x7f00ff | 0x600;
    break;
  default:
    switch(sVar2) {
    case '<':
      local_50.t._0_4_ = 2;
      local_50.t._4_4_ = 0;
      uStack_48 = 0;
      uStack_44 = 0;
      local_3c = 0;
      local_38 = "default";
      QMessageLogger::debug();
      QVar6.stream = local_78.stream;
      QVar13.m_data = (storage_type *)0x1c;
      QVar13.m_size = (qsizetype)&local_70;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)&local_70);
      piVar4 = (int *)CONCAT44(uStack_6c,local_70);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),2,8);
        }
      }
      if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.stream,' ');
      }
      goto LAB_001730d6;
    case '=':
      local_50.t._0_4_ = 2;
      local_50.t._4_4_ = 0;
      uStack_48 = 0;
      uStack_44 = 0;
      local_3c = 0;
      local_38 = "default";
      QMessageLogger::debug();
      QVar6.stream = local_78.stream;
      QVar14.m_data = (storage_type *)0x1b;
      QVar14.m_size = (qsizetype)&local_70;
      QString::fromUtf8(QVar14);
      QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)&local_70);
      piVar4 = (int *)CONCAT44(uStack_6c,local_70);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),2,8);
        }
      }
      if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.stream,' ');
      }
      QDebug::~QDebug(&local_78);
      qVar12 = 1;
      goto switchD_00172cc6_caseD_8;
    case '>':
      local_50.t._0_4_ = 2;
      local_50.t._4_4_ = 0;
      uStack_48 = 0;
      uStack_44 = 0;
      local_3c = 0;
      local_38 = "default";
      QMessageLogger::debug();
      QVar6.stream = local_78.stream;
      QVar15.m_data = (storage_type *)0x1d;
      QVar15.m_size = (qsizetype)&local_70;
      QString::fromUtf8(QVar15);
      QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)&local_70);
      piVar4 = (int *)CONCAT44(uStack_6c,local_70);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),2,8);
        }
      }
      if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.stream,' ');
      }
LAB_001730d6:
      QDebug::~QDebug(&local_78);
      break;
    case '?':
    case '@':
    case 'A':
    case 'B':
      goto switchD_00172cc6_caseD_8;
    case 'C':
      lVar9 = (this->clients).d.size;
      uVar10 = (uint)(ushort)(*(ushort *)&seq_event->data << 8 | *(ushort *)&seq_event->data >> 8);
      if (0 < lVar9) {
        lVar8 = -0x100000000;
        uVar11 = 0xfffffffffffffffc;
        do {
          if (lVar9 * -4 + uVar11 == -4) goto LAB_0017302a;
          lVar8 = lVar8 + 0x100000000;
          uVar1 = uVar11 + 4;
          lVar5 = uVar11 + 4;
          uVar11 = uVar1;
        } while (*(uint *)((long)(this->clients).d.ptr + lVar5) != uVar10);
        if (((int)(~uVar1 >> 2) != 0) &&
           (midiSession_00 =
                 *(MidiSession **)
                  ((long)(this->super_MidiDriver).midiSessions.d.ptr + (lVar8 >> 0x1d)),
           midiSession_00 != (MidiSession *)0x0)) {
          MidiDriver::deleteMidiSession(&this->super_MidiDriver,midiSession_00);
        }
      }
LAB_0017302a:
      local_50.t = &local_70;
      local_70 = uVar10;
      QtPrivate::
      sequential_erase_if<QList<unsigned_int>,QtPrivate::sequential_erase<QList<unsigned_int>,unsigned_int>(QList<unsigned_int>&,unsigned_int_const&)::_lambda(auto:1&)_1_>
                (&this->clients,&local_50);
      break;
    default:
      if (sVar2 != 0x82) goto switchD_00172cc6_caseD_8;
      uVar10 = (seq_event->data).raw32.d[0];
      if ((ulong)uVar10 != 0) {
        abuf = (uchar *)(seq_event->data).ext.ptr;
        uVar3 = abuf[uVar10 - 1];
        if ((*abuf == 0xf0) && (uVar3 == 0xf7)) {
          MVar7 = MasterClock::getClockNanos();
          SynthRoute::pushMIDISysex(this_00,midiSession,abuf,uVar10,MVar7);
        }
        else {
          local_58 = &this->sysexBuffer;
          QVarLengthArray<unsigned_char,_1000LL>::append(local_58,abuf,(ulong)uVar10);
          if (uVar3 == 0xf7) {
            sysexData = (this->sysexBuffer).ptr;
            qVar12 = (this->sysexBuffer).s;
            MVar7 = MasterClock::getClockNanos();
            SynthRoute::pushMIDISysex(this_00,midiSession,sysexData,(uint)qVar12,MVar7);
            lVar9 = (this->sysexBuffer).a;
            qVar12 = 0;
            if (lVar9 < 1) {
              lVar9 = qVar12;
            }
            QVarLengthArray<unsigned_char,_1000LL>::reallocate(local_58,0,lVar9);
            goto switchD_00172cc6_caseD_8;
          }
        }
      }
    }
    goto LAB_001730de;
  }
  MVar7 = MasterClock::getClockNanos();
  SynthRoute::pushMIDIShortMessage(this_00,midiSession,msg,MVar7);
LAB_001730de:
  qVar12 = 0;
switchD_00172cc6_caseD_8:
  return SUB81(qVar12,0);
}

Assistant:

bool ALSAMidiDriver::processSeqEvent(snd_seq_event_t *seq_event, MidiSession *midiSession) {
	SynthRoute *synthRoute = midiSession->getSynthRoute();
	MT32Emu::Bit32u msg = 0;
	switch(seq_event->type) {
	case SND_SEQ_EVENT_NOTEON:
		msg = 0x90;
		msg |= seq_event->data.note.channel;
		msg |= seq_event->data.note.note << 8;
		msg |= seq_event->data.note.velocity << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_NOTEOFF:
		msg = 0x80;
		msg |= seq_event->data.note.channel;
		msg |= seq_event->data.note.note << 8;
		msg |= seq_event->data.note.velocity << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_CONTROLLER:
		msg = 0xB0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.param << 8;
		msg |= seq_event->data.control.value << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_CONTROL14:
		// The real hardware units don't support any of LSB controllers,
		// so we just send the MSB silently ignoring the LSB
		if ((seq_event->data.control.param & 0xE0) == 0x20) break;
		msg = 0xB0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.param << 8;
		msg |= (seq_event->data.control.value >> 7) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_NONREGPARAM:
		// The real hardware units don't support NRPNs
		break;

	case SND_SEQ_EVENT_REGPARAM:
		// The real hardware units support only RPN 0 (pitch bender range) and only MSB matters
		if (seq_event->data.control.param != 0) break;
		msg = 0x64B0;
		msg |= seq_event->data.control.channel;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());

		msg &= 0xFF;
		msg |= 0x6500;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());

		msg &= 0xFF;
		msg |= 0x0600;
		msg |= ((seq_event->data.control.value >> 7) & 0x7F) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_PGMCHANGE:
		msg = 0xC0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.value << 8;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_PITCHBEND:
		msg = 0xE0;
		msg |= seq_event->data.control.channel;
		int bend;
		bend = seq_event->data.control.value + 8192;
		msg |= (bend & 0x7F) << 8;
		msg |= ((bend >> 7) & 0x7F) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_SYSEX: {
		MT32Emu::Bit8u *sysexData = (MT32Emu::Bit8u *)seq_event->data.ext.ptr;
		uint sysexLength = seq_event->data.ext.len;

		if(sysexLength == 0) break; // no-op

		// We may well get a SysEx fragment, so if this is the case, it's buffered and the full SysEx is reconstructed further on.
		// If not, don't bother and take a shortcut.
		bool hasSysexStart = sysexData[0] == MIDI_CMD_COMMON_SYSEX;
		bool hasSysexEnd = sysexData[sysexLength - 1] == MIDI_CMD_COMMON_SYSEX_END;
		if (hasSysexStart && hasSysexEnd) {
			synthRoute->pushMIDISysex(*midiSession, sysexData, sysexLength, MasterClock::getClockNanos());
			break;
		}
		// OK, accumulate SysEx data received so far and commit when ready.
		sysexBuffer.append(sysexData, sysexLength);
		if (hasSysexEnd) {
			synthRoute->pushMIDISysex(*midiSession, sysexBuffer.constData(), sysexBuffer.size(), MasterClock::getClockNanos());
			sysexBuffer.clear();
		}
		break;
	}

	case SND_SEQ_EVENT_PORT_SUBSCRIBED:
		// no-op
		break;
	case SND_SEQ_EVENT_PORT_UNSUBSCRIBED:
		unsigned int clientAddr;
		clientAddr = getSourceAddr(seq_event);
		MidiSession *midiSession;
		midiSession = findMidiSessionForClient(clientAddr);
		if (midiSession != NULL) deleteMidiSession(midiSession);
		clients.removeAll(clientAddr);
		break;

	case SND_SEQ_EVENT_CLIENT_START:
		qDebug() << "ALSAMidiDriver: Client start";
		break;
	case SND_SEQ_EVENT_CLIENT_CHANGE:
		qDebug() << "ALSAMidiDriver: Client change";
		break;
	case SND_SEQ_EVENT_CLIENT_EXIT:
		qDebug() << "ALSAMidiDriver: Client exit";
		return true;

	case SND_SEQ_EVENT_NOTE:
		// FIXME: Implement these
		break;

	default:
		break;
	}
	return false;
}